

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O3

void helper_msa_mod_u_w_mipsel(CPUMIPSState_conflict4 *env,uint32_t wd,uint32_t ws,uint32_t wt)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (env->active_fpu).fpr[ws].fs[0];
  uVar1 = (env->active_fpu).fpr[wt].fs[0];
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  (env->active_fpu).fpr[wd].fs[0] = uVar2;
  uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 4);
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 4);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 4) = uVar2;
  uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 8);
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 8);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 8) = uVar2;
  uVar2 = *(uint *)((long)(env->active_fpu).fpr + (ulong)ws * 0x10 + 0xc);
  uVar1 = *(uint *)((long)(env->active_fpu).fpr + (ulong)wt * 0x10 + 0xc);
  if (uVar1 != 0) {
    uVar2 = uVar2 % uVar1;
  }
  *(uint *)((long)(env->active_fpu).fpr + (ulong)wd * 0x10 + 0xc) = uVar2;
  return;
}

Assistant:

void helper_msa_mod_u_w(CPUMIPSState *env,
                        uint32_t wd, uint32_t ws, uint32_t wt)
{
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    pwd->w[0]  = msa_mod_u_df(DF_WORD, pws->w[0],  pwt->w[0]);
    pwd->w[1]  = msa_mod_u_df(DF_WORD, pws->w[1],  pwt->w[1]);
    pwd->w[2]  = msa_mod_u_df(DF_WORD, pws->w[2],  pwt->w[2]);
    pwd->w[3]  = msa_mod_u_df(DF_WORD, pws->w[3],  pwt->w[3]);
}